

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::rc::TextureLevelArray::allocLevel
          (TextureLevelArray *this,int level,TextureFormat *format,int width,int height,int depth)

{
  TextureFormat *pTVar1;
  ConstPixelBufferAccess *pCVar2;
  int iVar3;
  undefined1 local_58 [24];
  int aiStack_40 [2];
  void *local_38;
  
  iVar3 = tcu::TextureFormat::getPixelSize(format);
  if ((uint)level < 0xe) {
    if (this->m_data[(uint)level].m_cap != 0) {
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear(this->m_data + (uint)level);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_58);
      this->m_access[(uint)level].super_ConstPixelBufferAccess.m_data = local_38;
      pCVar2 = &this->m_access[(uint)level].super_ConstPixelBufferAccess;
      *(undefined8 *)((pCVar2->m_size).m_data + 2) = local_58._16_8_;
      *(int (*) [2])((pCVar2->m_pitch).m_data + 1) = aiStack_40;
      pTVar1 = (TextureFormat *)(this->m_access + (uint)level);
      pTVar1->order = local_58._0_4_;
      pTVar1->type = local_58._4_4_;
      pTVar1[1].order = local_58._8_4_;
      pTVar1[1].type = local_58._12_4_;
    }
  }
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (this->m_data + level,(long)(iVar3 * depth * height * width));
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_58,format,width,height,depth,this->m_data[level].m_ptr);
  this->m_access[level].super_ConstPixelBufferAccess.m_data = local_38;
  pCVar2 = &this->m_access[level].super_ConstPixelBufferAccess;
  *(undefined8 *)((pCVar2->m_size).m_data + 2) = local_58._16_8_;
  *(int (*) [2])((pCVar2->m_pitch).m_data + 1) = aiStack_40;
  pTVar1 = (TextureFormat *)(this->m_access + level);
  pTVar1->order = local_58._0_4_;
  pTVar1->type = local_58._4_4_;
  pTVar1[1].order = local_58._8_4_;
  pTVar1[1].type = local_58._12_4_;
  return;
}

Assistant:

void TextureLevelArray::allocLevel (int level, const tcu::TextureFormat& format, int width, int height, int depth)
{
	const int dataSize = format.getPixelSize()*width*height*depth;

	DE_ASSERT(deInBounds32(level, 0, DE_LENGTH_OF_ARRAY(m_data)));

	if (hasLevel(level))
		clearLevel(level);

	m_data[level].setStorage(dataSize);
	m_access[level] = PixelBufferAccess(format, width, height, depth, m_data[level].getPtr());
}